

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O1

ostream * ccs::anon_unknown_1::operator<<(ostream *os,Streamer *ss)

{
  char cVar1;
  bool bVar2;
  undefined8 in_RAX;
  _Base_ptr p_Var3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_38;
  
  if ((ss->style->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uStack_38 = in_RAX;
    if (ss->root == false) {
      uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
      uStack_38._0_6_ = (undefined6)in_RAX;
      uStack_38._0_7_ = CONCAT16(0x5b,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
    }
    p_Var3 = (ss->style->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var3 != &(ss->style->_M_t)._M_impl.super__Rb_tree_header) {
      bVar2 = true;
      do {
        if ((!bVar2) && (ss->root == false)) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(os,"=\"",2);
        if (p_Var3[2]._M_parent != (_Base_ptr)0x0) {
          pcVar5 = *(char **)(p_Var3 + 2);
          do {
            cVar1 = *pcVar5;
            if (cVar1 == '\t') {
              lVar4 = 2;
              pcVar6 = "\\t";
            }
            else if (cVar1 == '\n') {
              lVar4 = 2;
              pcVar6 = "\\n";
            }
            else if (cVar1 == '\"') {
              lVar4 = 2;
              pcVar6 = "\\\"";
            }
            else {
              uStack_38._0_6_ = CONCAT15(cVar1,(undefined5)uStack_38);
              lVar4 = 1;
              pcVar6 = (char *)((long)&uStack_38 + 5);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
            pcVar5 = pcVar5 + 1;
          } while (pcVar5 != (char *)((long)&(p_Var3[2]._M_parent)->_M_color + *(long *)(p_Var3 + 2)
                                     ));
        }
        uStack_38._0_5_ = CONCAT14(0x22,(undefined4)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 4),1);
        if (ss->root != false) {
          std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        bVar2 = false;
      } while ((_Rb_tree_header *)p_Var3 != &(ss->style->_M_t)._M_impl.super__Rb_tree_header);
    }
    if (ss->root == false) {
      uStack_38 = CONCAT17(0x5d,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    }
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Streamer &ss) {
    if (!ss.style.empty()) {
      bool first = true;
      if (!ss.root) os << '[';
      for (auto it = ss.style.cbegin(); it != ss.style.cend(); ++it) {
        if (!first && !ss.root) os << ", ";
        first = false;
        os << it->first;
        os << "=\"";
        for (auto cit = it->second.cbegin(); cit != it->second.cend(); ++cit) {
          switch (*cit) {
            default: os << *cit; break;
            case '"': os << "\\\""; break;
            case '\n': os << "\\n"; break;
            case '\t': os << "\\t"; break;
          }
        }
        os << '"';
        if (ss.root) os << ";";
      }
      if (!ss.root) os << ']';
    }
    return os;
  }